

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorSet::FileDescriptorSet
          (FileDescriptorSet *this,FileDescriptorSet *from)

{
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  long in_RSI;
  undefined8 *in_RDI;
  Arena *in_stack_ffffffffffffff58;
  InternalMetadataWithArena *in_stack_ffffffffffffff60;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *in_stack_ffffffffffffff68;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *in_stack_ffffffffffffff70;
  Container *local_20;
  
  Message::Message((Message *)in_stack_ffffffffffffff60);
  *in_RDI = &PTR__FileDescriptorSet_00899830;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  *(undefined4 *)(in_RDI + 2) = *(undefined4 *)(in_RSI + 0x10);
  internal::CachedSize::CachedSize((CachedSize *)0x67329c);
  RepeatedPtrField<google::protobuf::FileDescriptorProto>::RepeatedPtrField
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 8);
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    if (((uint)*(undefined8 *)this_00 & 1) == 1) {
      local_20 = internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           (this_00);
    }
    else {
      local_20 = (Container *)internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)local_20,(UnknownFieldSet *)in_stack_ffffffffffffff58);
  }
  return;
}

Assistant:

FileDescriptorSet::FileDescriptorSet(const FileDescriptorSet& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      file_(from.file_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:google.protobuf.FileDescriptorSet)
}